

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O0

FT_Error af_latin_metrics_init(AF_LatinMetrics metrics,FT_Face face)

{
  FT_CharMap charmap;
  FT_Error FVar1;
  FT_CharMap oldmap;
  FT_Face face_local;
  AF_LatinMetrics metrics_local;
  
  charmap = face->charmap;
  metrics->units_per_em = (uint)face->units_per_EM;
  FVar1 = FT_Select_Charmap(face,FT_ENCODING_UNICODE);
  if (FVar1 == 0) {
    af_latin_metrics_init_widths(metrics,face);
    af_latin_metrics_init_blues(metrics,face);
    af_latin_metrics_check_digits(metrics,face);
  }
  FT_Set_Charmap(face,charmap);
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_latin_metrics_init( AF_LatinMetrics  metrics,
                         FT_Face          face )
  {
    FT_CharMap  oldmap = face->charmap;


    metrics->units_per_em = face->units_per_EM;

    if ( !FT_Select_Charmap( face, FT_ENCODING_UNICODE ) )
    {
      af_latin_metrics_init_widths( metrics, face );
      af_latin_metrics_init_blues( metrics, face );
      af_latin_metrics_check_digits( metrics, face );
    }

    FT_Set_Charmap( face, oldmap );
    return FT_Err_Ok;
  }